

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O3

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  v4sf one;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar16 = _DAT_003143b0;
  auVar2 = _DAT_003143a0;
  uVar3 = bottom_top_blob->c;
  uVar10 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar3) {
      uVar7 = 0;
      auVar30 = _DAT_00314440;
      do {
        if (0 < (int)uVar10) {
          pauVar8 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          uVar9 = uVar10;
          do {
            auVar1 = *pauVar8;
            auVar12 = minps(auVar1,auVar2);
            auVar12 = maxps(auVar12,auVar16);
            fVar25 = auVar12._0_4_ * 1.442695 + 0.5;
            fVar26 = auVar12._4_4_ * 1.442695 + 0.5;
            fVar27 = auVar12._8_4_ * 1.442695 + 0.5;
            fVar28 = auVar12._12_4_ * 1.442695 + 0.5;
            fVar21 = (float)(int)fVar25;
            fVar22 = (float)(int)fVar26;
            fVar23 = (float)(int)fVar27;
            fVar24 = (float)(int)fVar28;
            fVar21 = fVar21 - (float)(-(uint)(fVar25 < fVar21) & 0x3f800000);
            fVar22 = fVar22 - (float)(-(uint)(fVar26 < fVar22) & 0x3f800000);
            fVar23 = fVar23 - (float)(-(uint)(fVar27 < fVar23) & 0x3f800000);
            fVar24 = fVar24 - (float)(-(uint)(fVar28 < fVar24) & 0x3f800000);
            fVar25 = auVar12._0_4_ - fVar21 * 0.6931472;
            fVar26 = auVar12._4_4_ - fVar22 * 0.6931472;
            fVar27 = auVar12._8_4_ - fVar23 * 0.6931472;
            fVar28 = auVar12._12_4_ - fVar24 * 0.6931472;
            auVar29._0_4_ =
                 (float)((int)fVar21 * 0x800000 + 0x3f800000) *
                 (fVar25 + 1.0 +
                 (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                   0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25) + 1.0;
            auVar29._4_4_ =
                 (float)((int)fVar22 * 0x800000 + 0x3f800000) *
                 (fVar26 + 1.0 +
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26) + 1.0;
            auVar29._8_4_ =
                 (float)((int)fVar23 * 0x800000 + 0x3f800000) *
                 (fVar27 + 1.0 +
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27) + 1.0;
            auVar29._12_4_ =
                 (float)((int)fVar24 * 0x800000 + 0x3f800000) *
                 (fVar28 + 1.0 +
                 (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                   0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28) + 1.0;
            auVar30 = maxps(auVar29,auVar30);
            fVar25 = (float)(auVar30._0_4_ & 0x807fffff | 0x3f000000);
            fVar27 = (float)(auVar30._4_4_ & 0x807fffff | 0x3f000000);
            fVar21 = (float)(auVar30._8_4_ & 0x807fffff | 0x3f000000);
            fVar23 = (float)(auVar30._12_4_ & 0x807fffff | 0x3f000000);
            fVar26 = fVar25 + -1.0 + (float)(-(uint)(fVar25 < 0.70710677) & (uint)fVar25);
            fVar28 = fVar27 + -1.0 + (float)(-(uint)(fVar27 < 0.70710677) & (uint)fVar27);
            fVar22 = fVar21 + -1.0 + (float)(-(uint)(fVar21 < 0.70710677) & (uint)fVar21);
            fVar24 = fVar23 + -1.0 + (float)(-(uint)(fVar23 < 0.70710677) & (uint)fVar23);
            auVar15._0_4_ =
                 ~-(uint)(auVar29._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar30._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar25 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                        (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26
                              + -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26
                           + 0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 +
                        -0.5) * fVar26 * fVar26) * -2.0);
            auVar15._4_4_ =
                 ~-(uint)(auVar29._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar30._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar27 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar28 +
                        (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28
                              + -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28
                           + 0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 +
                        -0.5) * fVar28 * fVar28) * -2.0);
            auVar15._8_4_ =
                 ~-(uint)(auVar29._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar30._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar21 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar22 +
                        (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) * fVar22
                              + -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057) * fVar22
                           + 0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) * fVar22 +
                        -0.5) * fVar22 * fVar22) * -2.0);
            auVar15._12_4_ =
                 ~-(uint)(auVar29._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar30._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar23 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar24 +
                        (((((((((fVar24 * 0.070376836 + -0.1151461) * fVar24 + 0.116769984) * fVar24
                              + -0.12420141) * fVar24 + 0.14249323) * fVar24 + -0.16668057) * fVar24
                           + 0.20000714) * fVar24 + -0.24999994) * fVar24 + 0.3333333) * fVar24 +
                        -0.5) * fVar24 * fVar24) * -2.0);
            auVar13._0_8_ =
                 CONCAT44(-(uint)(auVar29._4_4_ <= 0.0),-(uint)(auVar29._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar13._8_4_ = -(uint)(auVar29._8_4_ <= 0.0) & 0x7fffffff;
            auVar13._12_4_ = -(uint)(auVar29._12_4_ <= 0.0) & 0x7fffffff;
            auVar30 = minps(auVar13 | auVar15,auVar2);
            auVar30 = maxps(auVar30,auVar16);
            fVar25 = auVar30._0_4_ * 1.442695 + 0.5;
            fVar26 = auVar30._4_4_ * 1.442695 + 0.5;
            fVar27 = auVar30._8_4_ * 1.442695 + 0.5;
            fVar28 = auVar30._12_4_ * 1.442695 + 0.5;
            fVar21 = (float)(int)fVar25;
            fVar22 = (float)(int)fVar26;
            fVar23 = (float)(int)fVar27;
            fVar24 = (float)(int)fVar28;
            fVar21 = fVar21 - (float)(-(uint)(fVar25 < fVar21) & 0x3f800000);
            fVar22 = fVar22 - (float)(-(uint)(fVar26 < fVar22) & 0x3f800000);
            fVar23 = fVar23 - (float)(-(uint)(fVar27 < fVar23) & 0x3f800000);
            fVar24 = fVar24 - (float)(-(uint)(fVar28 < fVar24) & 0x3f800000);
            fVar25 = auVar30._0_4_ - fVar21 * 0.6931472;
            fVar26 = auVar30._4_4_ - fVar22 * 0.6931472;
            fVar27 = auVar30._8_4_ - fVar23 * 0.6931472;
            fVar28 = auVar30._12_4_ - fVar24 * 0.6931472;
            auVar14._0_4_ =
                 fVar25 + 1.0 +
                 (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                   0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25;
            auVar14._4_4_ =
                 fVar26 + 1.0 +
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26;
            auVar14._8_4_ =
                 fVar27 + 1.0 +
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27;
            auVar14._12_4_ =
                 fVar28 + 1.0 +
                 (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                   0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28;
            fVar21 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar14._0_4_ + 1.0;
            fVar22 = (float)((int)fVar22 * 0x800000 + 0x3f800000) * auVar14._4_4_ + 1.0;
            fVar23 = (float)((int)fVar23 * 0x800000 + 0x3f800000) * auVar14._8_4_ + 1.0;
            fVar24 = (float)((int)fVar24 * 0x800000 + 0x3f800000) * auVar14._12_4_ + 1.0;
            auVar5._4_4_ = fVar22;
            auVar5._0_4_ = fVar21;
            auVar5._8_4_ = fVar23;
            auVar5._12_4_ = fVar24;
            auVar30 = rcpps(auVar14,auVar5);
            fVar25 = auVar30._0_4_;
            fVar26 = auVar30._4_4_;
            fVar27 = auVar30._8_4_;
            fVar28 = auVar30._12_4_;
            local_48 = auVar1._0_4_;
            fStack_44 = auVar1._4_4_;
            fStack_40 = auVar1._8_4_;
            fStack_3c = auVar1._12_4_;
            *(float *)*pauVar8 =
                 (fVar25 + fVar25 + -1.0 + (2.0 - fVar21 * (fVar25 + fVar25)) * fVar25) * local_48;
            *(float *)(*pauVar8 + 4) =
                 (fVar26 + fVar26 + -1.0 + (2.0 - fVar22 * (fVar26 + fVar26)) * fVar26) * fStack_44;
            *(float *)(*pauVar8 + 8) =
                 (fVar27 + fVar27 + -1.0 + (2.0 - fVar23 * (fVar27 + fVar27)) * fVar27) * fStack_40;
            *(float *)(*pauVar8 + 0xc) =
                 (fVar28 + fVar28 + -1.0 + (2.0 - fVar24 * (fVar28 + fVar28)) * fVar28) * fStack_3c;
            pauVar8 = pauVar8 + 1;
            uVar9 = uVar9 - 1;
            auVar30 = _DAT_00314440;
          } while (uVar9 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
  }
  else if (0 < (int)uVar3) {
    uVar7 = 0;
    do {
      pauVar8 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar10 < 4) {
        uVar9 = 0;
      }
      else {
        iVar6 = 3;
        do {
          auVar2 = *pauVar8;
          auVar30._8_4_ = 0x42b0c0a5;
          auVar30._0_8_ = 0x42b0c0a542b0c0a5;
          auVar30._12_4_ = 0x42b0c0a5;
          auVar16 = minps(auVar2,auVar30);
          auVar12._8_4_ = 0xc2b0c0a5;
          auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar12._12_4_ = 0xc2b0c0a5;
          auVar16 = maxps(auVar16,auVar12);
          fVar25 = auVar16._0_4_ * 1.442695 + 0.5;
          fVar26 = auVar16._4_4_ * 1.442695 + 0.5;
          fVar27 = auVar16._8_4_ * 1.442695 + 0.5;
          fVar28 = auVar16._12_4_ * 1.442695 + 0.5;
          fVar21 = (float)(int)fVar25;
          fVar22 = (float)(int)fVar26;
          fVar23 = (float)(int)fVar27;
          fVar24 = (float)(int)fVar28;
          fVar21 = fVar21 - (float)(-(uint)(fVar25 < fVar21) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar26 < fVar22) & 0x3f800000);
          fVar23 = fVar23 - (float)(-(uint)(fVar27 < fVar23) & 0x3f800000);
          fVar24 = fVar24 - (float)(-(uint)(fVar28 < fVar24) & 0x3f800000);
          fVar25 = auVar16._0_4_ - fVar21 * 0.6931472;
          fVar26 = auVar16._4_4_ - fVar22 * 0.6931472;
          fVar27 = auVar16._8_4_ - fVar23 * 0.6931472;
          fVar28 = auVar16._12_4_ - fVar24 * 0.6931472;
          auVar19._0_4_ =
               (float)((int)fVar21 * 0x800000 + 0x3f800000) *
               (fVar25 + 1.0 +
               (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                 0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25) + 1.0;
          auVar19._4_4_ =
               (float)((int)fVar22 * 0x800000 + 0x3f800000) *
               (fVar26 + 1.0 +
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26) + 1.0;
          auVar19._8_4_ =
               (float)((int)fVar23 * 0x800000 + 0x3f800000) *
               (fVar27 + 1.0 +
               (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27) + 1.0;
          auVar19._12_4_ =
               (float)((int)fVar24 * 0x800000 + 0x3f800000) *
               (fVar28 + 1.0 +
               (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28) + 1.0;
          auVar16 = maxps(auVar19,_DAT_00314440);
          fVar25 = (float)(auVar16._0_4_ & 0x807fffff | 0x3f000000);
          fVar27 = (float)(auVar16._4_4_ & 0x807fffff | 0x3f000000);
          fVar21 = (float)(auVar16._8_4_ & 0x807fffff | 0x3f000000);
          fVar23 = (float)(auVar16._12_4_ & 0x807fffff | 0x3f000000);
          fVar26 = fVar25 + -1.0 + (float)(-(uint)(fVar25 < 0.70710677) & (uint)fVar25);
          fVar28 = fVar27 + -1.0 + (float)(-(uint)(fVar27 < 0.70710677) & (uint)fVar27);
          fVar22 = fVar21 + -1.0 + (float)(-(uint)(fVar21 < 0.70710677) & (uint)fVar21);
          fVar24 = fVar23 + -1.0 + (float)(-(uint)(fVar23 < 0.70710677) & (uint)fVar23);
          auVar20._0_4_ =
               ~-(uint)(auVar19._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar16._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar25 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                      (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                            -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                         0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5)
                      * fVar26 * fVar26) * -2.0);
          auVar20._4_4_ =
               ~-(uint)(auVar19._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar16._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar27 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar28 +
                      (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                            -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                         0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5)
                      * fVar28 * fVar28) * -2.0);
          auVar20._8_4_ =
               ~-(uint)(auVar19._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar16._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar21 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar22 +
                      (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) * fVar22 +
                            -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057) * fVar22 +
                         0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) * fVar22 + -0.5)
                      * fVar22 * fVar22) * -2.0);
          auVar20._12_4_ =
               ~-(uint)(auVar19._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar16._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar23 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar24 +
                      (((((((((fVar24 * 0.070376836 + -0.1151461) * fVar24 + 0.116769984) * fVar24 +
                            -0.12420141) * fVar24 + 0.14249323) * fVar24 + -0.16668057) * fVar24 +
                         0.20000714) * fVar24 + -0.24999994) * fVar24 + 0.3333333) * fVar24 + -0.5)
                      * fVar24 * fVar24) * -2.0);
          auVar17._0_8_ =
               CONCAT44(-(uint)(auVar19._4_4_ <= 0.0),-(uint)(auVar19._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar17._8_4_ = -(uint)(auVar19._8_4_ <= 0.0) & 0x7fffffff;
          auVar17._12_4_ = -(uint)(auVar19._12_4_ <= 0.0) & 0x7fffffff;
          auVar1._8_4_ = 0x42b0c0a5;
          auVar1._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1._12_4_ = 0x42b0c0a5;
          auVar16 = minps(auVar17 | auVar20,auVar1);
          auVar4._8_4_ = 0xc2b0c0a5;
          auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar4._12_4_ = 0xc2b0c0a5;
          auVar16 = maxps(auVar16,auVar4);
          fVar25 = auVar16._0_4_ * 1.442695 + 0.5;
          fVar26 = auVar16._4_4_ * 1.442695 + 0.5;
          fVar27 = auVar16._8_4_ * 1.442695 + 0.5;
          fVar28 = auVar16._12_4_ * 1.442695 + 0.5;
          fVar21 = (float)(int)fVar25;
          fVar22 = (float)(int)fVar26;
          fVar23 = (float)(int)fVar27;
          fVar24 = (float)(int)fVar28;
          fVar21 = fVar21 - (float)(-(uint)(fVar25 < fVar21) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar26 < fVar22) & 0x3f800000);
          fVar23 = fVar23 - (float)(-(uint)(fVar27 < fVar23) & 0x3f800000);
          fVar24 = fVar24 - (float)(-(uint)(fVar28 < fVar24) & 0x3f800000);
          fVar25 = auVar16._0_4_ - fVar21 * 0.6931472;
          fVar26 = auVar16._4_4_ - fVar22 * 0.6931472;
          fVar27 = auVar16._8_4_ - fVar23 * 0.6931472;
          fVar28 = auVar16._12_4_ - fVar24 * 0.6931472;
          auVar18._0_4_ =
               fVar25 + 1.0 +
               (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                 0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25;
          auVar18._4_4_ =
               fVar26 + 1.0 +
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26;
          auVar18._8_4_ =
               fVar27 + 1.0 +
               (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27;
          auVar18._12_4_ =
               fVar28 + 1.0 +
               (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28;
          fVar21 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar18._0_4_ + 1.0;
          fVar22 = (float)((int)fVar22 * 0x800000 + 0x3f800000) * auVar18._4_4_ + 1.0;
          fVar23 = (float)((int)fVar23 * 0x800000 + 0x3f800000) * auVar18._8_4_ + 1.0;
          fVar24 = (float)((int)fVar24 * 0x800000 + 0x3f800000) * auVar18._12_4_ + 1.0;
          auVar16._4_4_ = fVar22;
          auVar16._0_4_ = fVar21;
          auVar16._8_4_ = fVar23;
          auVar16._12_4_ = fVar24;
          auVar16 = rcpps(auVar18,auVar16);
          fVar25 = auVar16._0_4_;
          fVar26 = auVar16._4_4_;
          fVar27 = auVar16._8_4_;
          fVar28 = auVar16._12_4_;
          *(float *)*pauVar8 =
               (fVar25 + fVar25 + -1.0 + (2.0 - fVar21 * (fVar25 + fVar25)) * fVar25) * auVar2._0_4_
          ;
          *(float *)(*pauVar8 + 4) =
               (fVar26 + fVar26 + -1.0 + (2.0 - fVar22 * (fVar26 + fVar26)) * fVar26) * auVar2._4_4_
          ;
          *(float *)(*pauVar8 + 8) =
               (fVar27 + fVar27 + -1.0 + (2.0 - fVar23 * (fVar27 + fVar27)) * fVar27) * auVar2._8_4_
          ;
          *(float *)(*pauVar8 + 0xc) =
               (fVar28 + fVar28 + -1.0 + (2.0 - fVar24 * (fVar28 + fVar28)) * fVar28) *
               auVar2._12_4_;
          pauVar8 = pauVar8 + 1;
          iVar6 = iVar6 + 4;
          uVar9 = uVar10 & 0xfffffffc;
        } while (iVar6 < (int)uVar10);
      }
      if (uVar10 - uVar9 != 0 && (int)uVar9 <= (int)uVar10) {
        lVar11 = 0;
        do {
          fVar25 = *(float *)(*pauVar8 + lVar11 * 4);
          fVar26 = expf(fVar25);
          fVar26 = logf(fVar26 + 1.0);
          fVar26 = tanhf(fVar26);
          *(float *)(*pauVar8 + lVar11 * 4) = fVar26 * fVar25;
          lVar11 = lVar11 + 1;
        } while (uVar10 - uVar9 != (int)lVar11);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}